

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoderValidator.cpp
# Opt level: O1

Result * CoreML::validate<(MLModelType)600>(Result *__return_storage_ptr__,Model *format)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  void *pvVar3;
  bool bVar4;
  undefined1 *puVar5;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  undefined1 *puVar6;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  Result result;
  allocator_type local_a1;
  pointer local_a0;
  _Alloc_hider local_98;
  size_type local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_78;
  undefined1 local_60 [8];
  _Alloc_hider local_58;
  undefined1 local_50 [24];
  TypeCase local_38 [2];
  
  puVar6 = (undefined1 *)format->description_;
  if ((ModelDescription *)puVar6 == (ModelDescription *)0x0) {
    puVar6 = Specification::_ModelDescription_default_instance_;
  }
  Result::Result((Result *)&local_a0);
  local_78.
  super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = false;
  local_78.
  super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ._M_impl.super__Vector_impl_data._M_start._1_1_ = false;
  local_78.
  super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ._M_impl.super__Vector_impl_data._M_start._2_1_ = false;
  local_78.
  super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ._M_impl.super__Vector_impl_data._M_start._3_1_ = false;
  validateModelDescription
            ((Result *)local_60,(ModelDescription *)puVar6,format->specificationversion_,
             (ValidationPolicy *)&local_78);
  local_a0 = (pointer)local_60;
  std::__cxx11::string::operator=((string *)&local_98,(string *)&local_58);
  pcVar2 = local_50 + 8;
  if (local_58._M_p != pcVar2) {
    operator_delete(local_58._M_p,local_50._8_8_ + 1);
  }
  bVar4 = Result::good((Result *)&local_a0);
  if (bVar4) {
    local_38[0] = kInt64Type;
    local_38[1] = kStringType;
    __l._M_len = 2;
    __l._M_array = local_38;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector(&local_78,__l,&local_a1);
    validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              ((Result *)local_60,(CoreML *)&((ModelDescription *)puVar6)->input_,
               (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)&local_78,
               in_R8);
    local_a0 = (pointer)local_60;
    std::__cxx11::string::operator=((string *)&local_98,(string *)&local_58);
    if (local_58._M_p != pcVar2) {
      operator_delete(local_58._M_p,local_50._8_8_ + 1);
    }
    pvVar3 = (void *)CONCAT44(local_78.
                              super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                              ._M_impl.super__Vector_impl_data._M_start._4_4_,
                              local_78.
                              super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                              ._M_impl.super__Vector_impl_data._M_start._0_4_);
    if (pvVar3 != (void *)0x0) {
      operator_delete(pvVar3,(long)local_78.
                                   super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar3
                     );
    }
    bVar4 = Result::good((Result *)&local_a0);
    if (bVar4) {
      if (format->_oneof_case_[0] == 600) {
        puVar5 = (undefined1 *)(format->Type_).onehotencoder_;
      }
      else {
        puVar5 = Specification::_OneHotEncoder_default_instance_;
      }
      local_38[0] = ((OneHotEncoder *)puVar5)->outputsparse_ + 5;
      __l_00._M_len = 1;
      __l_00._M_array = local_38;
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::vector(&local_78,__l_00,&local_a1);
      validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                ((Result *)local_60,(CoreML *)&((ModelDescription *)puVar6)->output_,
                 (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)&local_78,
                 in_R8);
      local_a0 = (pointer)local_60;
      std::__cxx11::string::operator=((string *)&local_98,(string *)&local_58);
      if (local_58._M_p != pcVar2) {
        operator_delete(local_58._M_p,local_50._8_8_ + 1);
      }
      pvVar3 = (void *)CONCAT44(local_78.
                                super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                                ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                local_78.
                                super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                                ._M_impl.super__Vector_impl_data._M_start._0_4_);
      if (pvVar3 != (void *)0x0) {
        operator_delete(pvVar3,(long)local_78.
                                     super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pvVar3);
      }
      bVar4 = Result::good((Result *)&local_a0);
      if (bVar4) {
        if (format->_oneof_case_[0] == 600) {
          puVar6 = (undefined1 *)(format->Type_).onehotencoder_;
        }
        else {
          puVar6 = Specification::_OneHotEncoder_default_instance_;
        }
        if (((OneHotEncoder *)puVar6)->_oneof_case_[0] == 0) {
          local_60 = (undefined1  [8])local_50;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_60,"OneHotEncoder parameter incorrect type","");
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_60);
          if (local_60 != (undefined1  [8])local_50) {
            operator_delete((void *)local_60,local_50._0_8_ + 1);
          }
          goto LAB_0032e9b5;
        }
      }
    }
  }
  *(pointer *)__return_storage_ptr__ = local_a0;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_p == &local_88) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_88._M_allocated_capacity._1_7_,local_88._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_88._8_8_;
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_98._M_p;
    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
         CONCAT71(local_88._M_allocated_capacity._1_7_,local_88._M_local_buf[0]);
  }
  (__return_storage_ptr__->m_message)._M_string_length = local_90;
  local_90 = 0;
  local_88._M_local_buf[0] = '\0';
  local_98._M_p = (pointer)&local_88;
LAB_0032e9b5:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_p != &local_88) {
    operator_delete(local_98._M_p,
                    CONCAT71(local_88._M_allocated_capacity._1_7_,local_88._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_oneHotEncoder>(const Specification::Model& format) {
        const auto& interface = format.description();

        Result result;

        // Validate its a MLModel type.
        result = validateModelDescription(interface, format.specificationversion());
        if (!result.good()) {
            return result;
        }

        // Validate the inputs
        result = validateDescriptionsContainFeatureWithTypes(interface.input(), 1,
                                                             { Specification::FeatureType::kInt64Type,
                                                                 Specification::FeatureType::kStringType });
        if (!result.good()) {
            return result;
        }
        
        // If sparse then the input must be dictionary
        bool sparse = format.onehotencoder().outputsparse();

        result = validateDescriptionsContainFeatureWithTypes(interface.output(), 1,
                                                             {(sparse ? Specification::FeatureType::kDictionaryType : Specification::FeatureType::kMultiArrayType)});
        // Validate the outputs
        if (!result.good()) {
            return result;
        }
        
        // Validate the parameters
        switch (format.onehotencoder().CategoryType_case()) {
            case Specification::OneHotEncoder::kInt64Categories:
                break;
            case Specification::OneHotEncoder::kStringCategories:
                break;
            case Specification::OneHotEncoder::CATEGORYTYPE_NOT_SET:
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "OneHotEncoder parameter incorrect type");
        }

        return result;
    }